

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

uchar * stbiw__zlib_flushf(uchar *data,uint *bitbuffer,int *bitcount)

{
  uint uVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  uchar *local_20;
  
  if (7 < *bitcount) {
    puVar2 = data;
    piVar5 = bitcount;
    local_20 = data;
    do {
      iVar4 = (int)piVar5;
      if (puVar2 == (uchar *)0x0) {
LAB_001c8a30:
        stbiw__sbgrowf(&local_20,1,iVar4);
        iVar3 = *(int *)(local_20 + -4);
        iVar4 = iVar3 + 1;
        puVar2 = local_20;
      }
      else {
        iVar3 = *(int *)(puVar2 + -4);
        iVar4 = iVar3 + 1;
        if (*(int *)(puVar2 + -8) <= iVar4) goto LAB_001c8a30;
      }
      uVar1 = *bitbuffer;
      *(int *)(puVar2 + -4) = iVar4;
      puVar2[iVar3] = (uchar)uVar1;
      *bitbuffer = *bitbuffer >> 8;
      iVar4 = *bitcount;
      uVar1 = iVar4 - 8;
      piVar5 = (int *)(ulong)uVar1;
      *bitcount = uVar1;
      data = local_20;
    } while (0xf < iVar4);
  }
  return data;
}

Assistant:

static unsigned char *stbiw__zlib_flushf(unsigned char *data, unsigned int *bitbuffer, int *bitcount)
{
   while (*bitcount >= 8) {
      stbiw__sbpush(data, STBIW_UCHAR(*bitbuffer));
      *bitbuffer >>= 8;
      *bitcount -= 8;
   }
   return data;
}